

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O3

void generate_code_for_list(List *ls,int m68kop,ParsedOpcodeInfo *info,CCVariant *var)

{
  char cVar1;
  byte bVar2;
  uchar uVar3;
  TokenType TVar4;
  uint uVar5;
  anon_union_8_7_0ba269be_for_u aVar6;
  ListStruct **ppLVar7;
  int iVar8;
  TokenType TVar9;
  BOOL BVar10;
  ulong uVar11;
  char *pcVar12;
  ListStruct *pLVar13;
  ulong uVar14;
  uint *info_00;
  CCVariant *pCVar15;
  ListStruct *pLVar16;
  int m68kop_00;
  uint uVar17;
  ParsedOpcodeInfo *info_01;
  ParsedOpcodeInfo *extraout_RDX;
  ParsedOpcodeInfo *extraout_RDX_00;
  ParsedOpcodeInfo *info_02;
  ParsedOpcodeInfo *info_03;
  ParsedOpcodeInfo *info_04;
  ParsedOpcodeInfo *info_05;
  ParsedOpcodeInfo *info_06;
  ParsedOpcodeInfo *info_07;
  ParsedOpcodeInfo *info_08;
  ParsedOpcodeInfo *info_09;
  ParsedOpcodeInfo *info_10;
  ParsedOpcodeInfo *extraout_RDX_01;
  ParsedOpcodeInfo *extraout_RDX_02;
  ParsedOpcodeInfo *extraout_RDX_03;
  ParsedOpcodeInfo *extraout_RDX_04;
  ParsedOpcodeInfo *extraout_RDX_05;
  ParsedOpcodeInfo *info_11;
  ParsedOpcodeInfo *info_12;
  ParsedOpcodeInfo *extraout_RDX_06;
  ParsedOpcodeInfo *extraout_RDX_07;
  ParsedOpcodeInfo *extraout_RDX_08;
  ParsedOpcodeInfo *extraout_RDX_09;
  ParsedOpcodeInfo *extraout_RDX_10;
  ParsedOpcodeInfo *extraout_RDX_11;
  ParsedOpcodeInfo *pPVar18;
  ParsedOpcodeInfo *extraout_RDX_12;
  ParsedOpcodeInfo *extraout_RDX_13;
  ParsedOpcodeInfo *info_13;
  ParsedOpcodeInfo *info_14;
  FILE *pFVar19;
  size_t __size;
  char *pcVar20;
  FILE *pFVar21;
  Token *pTVar22;
  List *pLVar23;
  CCVariant *in_R8;
  bool bVar24;
  char buf [512];
  TokenType local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  
  pFVar19 = (FILE *)(ulong)(uint)m68kop;
  if (ls == (List *)0x0) {
    return;
  }
  pTVar22 = &ls->token;
  TVar4 = (ls->token).type;
  switch(TVar4) {
  case TOK_FALSE:
switchD_0010cd1b_caseD_0:
    pcVar12 = "0 ";
    break;
  case TOK_TRUE:
    pcVar12 = "1 ";
    break;
  case TOK_IF:
  case TOK_SWITCH:
  case TOK_DEFAULT:
  case TOK_AND:
  case TOK_OR:
  case TOK_XOR:
  case TOK_NOT:
  case TOK_EQUAL:
  case TOK_NOT_EQUAL:
  case TOK_GREATER_THAN:
  case TOK_LESS_THAN:
  case TOK_GREATER_OR_EQUAL:
  case TOK_LESS_OR_EQUAL:
  case TOK_IDENTIFIER:
  case TOK_LEFT_PAREN:
  case TOK_RIGHT_PAREN:
  case TOK_UNION:
  case TOK_INTERSECT:
  case TOK_SHIFT_LEFT:
  case TOK_SHIFT_RIGHT:
  case TOK_ASSIGN:
  case TOK_PLUS:
  case TOK_MINUS:
  case TOK_MULTIPLY:
  case TOK_DIVIDE:
  case TOK_MOD:
  case TOK_BITWISE_AND:
  case TOK_BITWISE_OR:
  case TOK_BITWISE_XOR:
  case TOK_BITWISE_NOT:
  case TOK_NUMARGS:
  case TOK_NIL:
  case TOK_FUNC_CALL:
  case TOK_CAST:
  case TOK_DEREF:
switchD_0010cd1b_caseD_2:
    pcVar12 = unparse_token(pTVar22,(char *)&local_238);
    pcVar20 = "Unknown code element: %s\n";
LAB_0010ce18:
    parse_error(ls,pcVar20,pcVar12);
    return;
  case TOK_DOLLAR_DATA_REGISTER:
    local_238 = pTVar22->type;
    uStack_234 = *(undefined4 *)&(ls->token).field_0x4;
    uStack_230 = *(undefined4 *)&(ls->token).u;
    uStack_22c = *(undefined4 *)((long)&(ls->token).u + 4);
    local_228 = *(undefined4 *)&(ls->token).filename;
    uStack_224 = *(undefined4 *)((long)&(ls->token).filename + 4);
    uStack_220 = (undefined4)(ls->token).lineno;
    uStack_21c = *(undefined4 *)((long)&(ls->token).lineno + 4);
    bVar24 = (ls->token).u.reginfo.sgnd == '\0';
    uVar11 = (ulong)(bVar24 + 0x53 + (uint)bVar24);
    pCVar15 = (CCVariant *)(ulong)(uint)(int)"?BW?L"[(ls->token).u.reginfo.size];
    pcVar12 = "DATA_REGISTER_%c%c (";
    goto LAB_0010d135;
  case TOK_DOLLAR_ADDRESS_REGISTER:
    local_238 = pTVar22->type;
    uStack_234 = *(undefined4 *)&(ls->token).field_0x4;
    uStack_230 = *(undefined4 *)&(ls->token).u;
    uStack_22c = *(undefined4 *)((long)&(ls->token).u + 4);
    local_228 = *(undefined4 *)&(ls->token).filename;
    uStack_224 = *(undefined4 *)((long)&(ls->token).filename + 4);
    uStack_220 = (undefined4)(ls->token).lineno;
    uStack_21c = *(undefined4 *)((long)&(ls->token).lineno + 4);
    bVar24 = (ls->token).u.reginfo.sgnd == '\0';
    uVar11 = (ulong)(bVar24 + 0x53 + (uint)bVar24);
    pCVar15 = (CCVariant *)(ulong)(uint)(int)"?BW?L"[(ls->token).u.reginfo.size];
    pcVar12 = "ADDRESS_REGISTER_%c%c ( ";
    goto LAB_0010d135;
  case TOK_DOLLAR_GENERAL_REGISTER:
    local_238 = pTVar22->type;
    uStack_234 = *(undefined4 *)&(ls->token).field_0x4;
    uStack_230 = *(undefined4 *)&(ls->token).u;
    uStack_22c = *(undefined4 *)((long)&(ls->token).u + 4);
    local_228 = *(undefined4 *)&(ls->token).filename;
    uStack_224 = *(undefined4 *)((long)&(ls->token).filename + 4);
    uStack_220 = (undefined4)(ls->token).lineno;
    uStack_21c = *(undefined4 *)((long)&(ls->token).lineno + 4);
    bVar24 = (ls->token).u.reginfo.sgnd == '\0';
    uVar11 = (ulong)(bVar24 + 0x53 + (uint)bVar24);
    pCVar15 = (CCVariant *)(ulong)(uint)(int)"?BW?L"[(ls->token).u.reginfo.size];
    pcVar12 = "GENERAL_REGISTER_%c%c (";
LAB_0010d135:
    fprintf((FILE *)syn68k_c_stream,pcVar12,uVar11);
    (ls->token).type = TOK_DOLLAR_NUMBER;
    *(uchar *)&(ls->token).u = '\0';
    *(uchar *)((long)&(ls->token).u + 1) = '\x04';
    generate_code_for_list(ls,(int)pcVar12,info_01,pCVar15);
    aVar6.n._4_4_ = uStack_22c;
    aVar6.n._0_4_ = uStack_230;
    (ls->token).filename = (char *)CONCAT44(uStack_224,local_228);
    (ls->token).lineno = CONCAT44(uStack_21c,uStack_220);
    *(ulong *)pTVar22 = CONCAT44(uStack_234,local_238);
    (ls->token).u = aVar6;
LAB_0010d163:
    fputs(") ",(FILE *)syn68k_c_stream);
    return;
  case TOK_DOLLAR_AMODE:
    uVar11 = (ulong)(ls->token).u.reginfo.size;
    uVar14 = (ulong)(ls->token).u.reginfo.sgnd;
    if (uVar11 != 4) {
      pcVar12 = ctypes[uVar14][uVar11];
      pcVar20 = "DEREF(%s, SYN68K_TO_US(cpu_state.amode_p)) ";
      goto LAB_0010d250;
    }
    uVar11 = (ulong)((uint)(uVar14 == 0) * 2 + 0x53);
    pcVar12 = "READ%cL_UNSWAPPED ( (cpu_state.amode_p)) ";
    goto LAB_0010d1e3;
  case TOK_DOLLAR_REVERSED_AMODE:
    uVar11 = (ulong)(ls->token).u.reginfo.size;
    uVar14 = (ulong)(ls->token).u.reginfo.sgnd;
    if (uVar11 != 4) {
      pcVar12 = ctypes[uVar14][uVar11];
      pcVar20 = "DEREF(%s, SYN68K_TO_US(cpu_state.reversed_amode_p)) ";
      goto LAB_0010d250;
    }
    uVar11 = (ulong)((uint)(uVar14 == 0) * 2 + 0x53);
    pcVar12 = "READ%cL_UNSWAPPED ( (cpu_state.reversed_amode_p)) ";
    goto LAB_0010d1e3;
  case TOK_DOLLAR_NUMBER:
    uVar11 = (ulong)(ls->token).u.reginfo.which;
    pcVar12 = "operand_%d ";
LAB_0010d1e3:
    fprintf((FILE *)syn68k_c_stream,pcVar12,uVar11);
    return;
  case TOK_DOLLAR_AMODE_PTR:
    pcVar12 = " (cpu_state.amode_p) ";
    __size = 0x15;
    goto LAB_0010d01a;
  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    pcVar12 = " (cpu_state.reversed_amode_p) ";
    __size = 0x1e;
LAB_0010d01a:
    fwrite(pcVar12,__size,1,(FILE *)syn68k_c_stream);
    return;
  case TOK_AMODE:
  case TOK_REVERSED_AMODE:
    uVar11 = (ulong)(ls->token).u.reginfo.size;
    uVar14 = (ulong)(ls->token).u.reginfo.sgnd;
    if (uVar11 != 4) {
      fprintf((FILE *)syn68k_c_stream,"DEREF(%s, CLEAN (",ctypes[uVar14][uVar11]);
      output_c_for_amode_ptr
                ((Token *)(ulong)(ls->token).u.reginfo.size,(uint)(ls->token).u.reginfo.which);
      goto LAB_0010ce77;
    }
    fprintf((FILE *)syn68k_c_stream,"READ%cL_UNSWAPPED (CLEAN",
            (ulong)((uint)(uVar14 == 0) * 2 + 0x53));
    output_c_for_amode_ptr
              ((Token *)(ulong)(ls->token).u.reginfo.size,(uint)(ls->token).u.reginfo.which);
    goto LAB_0010cd6f;
  case TOK_AMODE_PTR:
  case TOK_REVERSED_AMODE_PTR:
    fputs("(US_TO_SYN68K (",(FILE *)syn68k_c_stream);
    output_c_for_amode_ptr
              ((Token *)(ulong)(ls->token).u.reginfo.size,(uint)(ls->token).u.reginfo.which);
    pcVar12 = "))";
    break;
  case TOK_QUOTED_STRING:
    pcVar12 = (ls->token).u.string;
    pcVar20 = "%s ";
    goto LAB_0010d250;
  case TOK_NUMBER:
    pcVar12 = (char *)(ls->token).u.n;
    if (pcVar12 + -100 < (char *)0xffffffffffffff39) {
      pcVar20 = "((int32) 0x%lX) ";
    }
    else {
      pcVar20 = "%ld ";
    }
LAB_0010d250:
    fprintf((FILE *)syn68k_c_stream,pcVar20,pcVar12);
    return;
  case TOK_DATA_REGISTER:
    bVar24 = (ls->token).u.reginfo.sgnd == '\0';
    uVar17 = bVar24 + 0x53 + (uint)bVar24;
    cVar1 = "?BW?L"[(ls->token).u.reginfo.size];
    bVar2 = (ls->token).u.reginfo.which;
    pcVar12 = "DATA_REGISTER_%c%c (%d) ";
    goto LAB_0010d1b6;
  case TOK_ADDRESS_REGISTER:
    bVar24 = (ls->token).u.reginfo.sgnd == '\0';
    uVar17 = bVar24 + 0x53 + (uint)bVar24;
    cVar1 = "?BW?L"[(ls->token).u.reginfo.size];
    bVar2 = (ls->token).u.reginfo.which;
    pcVar12 = "ADDRESS_REGISTER_%c%c (%d) ";
LAB_0010d1b6:
    fprintf((FILE *)syn68k_c_stream,pcVar12,(ulong)uVar17,(ulong)(uint)(int)cVar1,(ulong)bVar2);
    return;
  case TOK_TEMP_REGISTER:
    fprintf((FILE *)syn68k_c_stream,"tmp%d%s ",(ulong)(ls->token).u.reginfo.which,
            regdesc[(ls->token).u.reginfo.sgnd][(ls->token).u.reginfo.size]);
    return;
  case TOK_NOP:
switchD_0010cd1b_caseD_23:
    return;
  case TOK_CCC:
    pcVar12 = "cpu_state.ccc ";
    break;
  case TOK_CCN:
    pcVar12 = "cpu_state.ccn ";
    break;
  case TOK_CCV:
    pcVar12 = "cpu_state.ccv ";
    break;
  case TOK_CCX:
    pcVar12 = "cpu_state.ccx ";
    break;
  case TOK_CCNZ:
    pcVar12 = "cpu_state.ccnz ";
    break;
  case TOK_CODE:
    pcVar12 = "code ";
    break;
  default:
    if (TVar4 != TOK_LIST) goto switchD_0010cd1b_caseD_2;
    ls = ls->car;
    if (ls == (List *)0x0) {
      return;
    }
    info_00 = &switchD_0010cde9::switchdataD_00112ba4;
    switch((ls->token).type) {
    case TOK_IF:
      pFVar19 = syn68k_c_stream;
      fputs("if (",(FILE *)syn68k_c_stream);
      generate_code_for_list(ls->cdr,(int)pFVar19,info_07,(CCVariant *)info_00);
      pFVar19 = syn68k_c_stream;
      fputs(") { ",(FILE *)syn68k_c_stream);
      generate_code_for_list(ls->cdr->cdr,(int)pFVar19,info_08,(CCVariant *)info_00);
      fputs(";} ",(FILE *)syn68k_c_stream);
      if (ls->cdr->cdr->cdr == (ListStruct *)0x0) {
        return;
      }
      pFVar19 = syn68k_c_stream;
      fputs("else { ",(FILE *)syn68k_c_stream);
      generate_code_for_list(ls->cdr->cdr->cdr,(int)pFVar19,info_09,(CCVariant *)info_00);
      pcVar12 = ";} ";
      break;
    case TOK_SWITCH:
      pFVar19 = syn68k_c_stream;
      fputs("switch (",(FILE *)syn68k_c_stream);
      generate_code_for_list(ls->cdr,(int)pFVar19,info_02,(CCVariant *)info_00);
      fputs(") {\n",(FILE *)syn68k_c_stream);
      pFVar21 = (FILE *)syn68k_c_stream;
      for (pLVar16 = ls->cdr->cdr; syn68k_c_stream = (FILE *)pFVar21, pLVar16 != (ListStruct *)0x0;
          pLVar16 = pLVar16->cdr) {
        if ((pLVar16->car->token).type == TOK_DEFAULT) {
          pcVar12 = "        default: ";
        }
        else {
          fputs("        case ",pFVar21);
          generate_code_for_list(pLVar16->car,(int)pFVar21,info_03,(CCVariant *)info_00);
          pcVar12 = ": ";
        }
        pFVar19 = syn68k_c_stream;
        fputs(pcVar12,(FILE *)syn68k_c_stream);
        generate_code_for_list(pLVar16->car->cdr,(int)pFVar19,info_04,(CCVariant *)info_00);
        fputs("; break;\n",(FILE *)syn68k_c_stream);
        pFVar21 = (FILE *)syn68k_c_stream;
      }
      pcVar12 = "}\n        ";
      break;
    case TOK_DEFAULT:
      pcVar12 = "default ";
      break;
    case TOK_AND:
      pLVar16 = ls->cdr;
      pcVar12 = "&&";
      goto LAB_0010d64b;
    case TOK_OR:
      pLVar16 = ls->cdr;
      pcVar12 = "||";
      goto LAB_0010d64b;
    case TOK_XOR:
      pLVar16 = ls->cdr;
      pFVar21 = (FILE *)syn68k_c_stream;
      while( true ) {
        if (pLVar16 == (List *)0x0) {
          syn68k_c_stream = (FILE *)pFVar21;
          return;
        }
        syn68k_c_stream = (FILE *)pFVar21;
        fputs("(!",pFVar21);
        generate_code_for_list(pLVar16,(int)pFVar21,info_10,(CCVariant *)info_00);
        fputs(") ",(FILE *)syn68k_c_stream);
        if (pLVar16->cdr == (ListStruct *)0x0) break;
        fputs("^ ",(FILE *)syn68k_c_stream);
        pLVar16 = pLVar16->cdr;
        pFVar21 = (FILE *)syn68k_c_stream;
      }
      return;
    case TOK_NOT:
      if (ls->cdr == (ListStruct *)0x0) {
        pcVar12 = "\"not\" missing an argument!\n";
LAB_0010d7f9:
        parse_error(ls,pcVar12);
        goto switchD_0010cd1b_caseD_0;
      }
      pcVar12 = "(!";
      goto LAB_0010d5b3;
    case TOK_EQUAL:
      pLVar16 = ls->cdr;
      pcVar12 = "==";
      goto LAB_0010d64b;
    case TOK_NOT_EQUAL:
      pLVar16 = ls->cdr;
      pcVar12 = "!=";
LAB_0010d64b:
      binary_op_list(pcVar12,pLVar16,(int)info,
                     (ParsedOpcodeInfo *)&switchD_0010cde9::switchdataD_00112ba4,in_R8);
      return;
    case TOK_GREATER_THAN:
    case TOK_LESS_THAN:
    case TOK_GREATER_OR_EQUAL:
    case TOK_LESS_OR_EQUAL:
    case TOK_SHIFT_LEFT:
    case TOK_SHIFT_RIGHT:
    case TOK_PLUS:
    case TOK_MINUS:
    case TOK_MULTIPLY:
    case TOK_DIVIDE:
    case TOK_MOD:
    case TOK_BITWISE_AND:
    case TOK_BITWISE_OR:
    case TOK_BITWISE_XOR:
      unparse_token(&ls->token,(char *)&local_238);
      binary_op_list((char *)&local_238,ls->cdr,m68kop_00,(ParsedOpcodeInfo *)info_00,in_R8);
      return;
    default:
      pcVar12 = unparse_token(&ls->token,(char *)&local_238);
      pcVar20 = "Unknown operator for code list: %s\n";
      goto LAB_0010ce18;
    case TOK_NOP:
      goto switchD_0010cd1b_caseD_23;
    case TOK_ASSIGN:
      putc(0x28,(FILE *)syn68k_c_stream);
      pLVar16 = ls->cdr;
      TVar4 = (pLVar16->token).type;
      TVar9 = TVar4;
      if (TVar4 != TOK_LIST) {
LAB_0010d71d:
        if (((TOK_REVERSED_AMODE < TVar9) || ((0x18c0000U >> (TVar9 & TOK_RIGHT_PAREN) & 1) == 0))
           || ((pLVar16->token).u.reginfo.size != '\x04')) {
          if (TVar4 == TOK_LIST) goto LAB_0010d163;
          goto LAB_0010d833;
        }
        iVar8 = 0x112f31;
        fprintf((FILE *)syn68k_c_stream,"WRITE%cL_UNSWAPPED (SYN68K_TO_US (CLEAN (",
                (ulong)((uint)((pLVar16->token).u.reginfo.sgnd == '\0') * 2 + 0x53));
        pLVar23 = ls->cdr;
        TVar4 = (pLVar23->token).type;
        if (TVar4 == TOK_AMODE) {
          (pLVar23->token).type = TOK_AMODE_PTR;
          generate_code_for_list(pLVar23,iVar8,info_11,(CCVariant *)pLVar16);
          (ls->cdr->token).type = TOK_AMODE;
        }
        else {
          if (TVar4 == TOK_DOLLAR_REVERSED_AMODE) {
            pcVar12 = " (cpu_state.reversed_amode_p) ";
          }
          else {
            if (TVar4 != TOK_DOLLAR_AMODE) {
              (pLVar23->token).type = TOK_REVERSED_AMODE_PTR;
              generate_code_for_list(pLVar23,iVar8,info_11,(CCVariant *)pLVar16);
              (ls->cdr->token).type = TOK_REVERSED_AMODE;
              goto LAB_0010da31;
            }
            pcVar12 = " (cpu_state.amode_p) ";
          }
          fputs(pcVar12,(FILE *)syn68k_c_stream);
        }
LAB_0010da31:
        pFVar19 = syn68k_c_stream;
        fputs(")), ",(FILE *)syn68k_c_stream);
        iVar8 = (int)pFVar19;
        pLVar13 = ls->cdr->cdr;
        pPVar18 = extraout_RDX_11;
LAB_0010da46:
        generate_code_for_list(pLVar13,iVar8,pPVar18,(CCVariant *)pLVar16);
        fputs(") ",(FILE *)syn68k_c_stream);
        goto LAB_0010d163;
      }
      pLVar13 = pLVar16->car;
      if (((pLVar13->token).type == TOK_DEREF) && ((pLVar13->token).u.reginfo.size == '\x04')) {
        bVar24 = (pLVar13->token).u.reginfo.sgnd == '\0';
        pCVar15 = (CCVariant *)(ulong)bVar24;
        iVar8 = 0x112f31;
        fprintf((FILE *)syn68k_c_stream,"WRITE%cL_UNSWAPPED (SYN68K_TO_US (CLEAN (",
                (ulong)((uint)bVar24 * 2 + 0x53));
        generate_code_for_list(ls->cdr->car->cdr,iVar8,info_05,pCVar15);
        pFVar19 = syn68k_c_stream;
        fputs(")), ",(FILE *)syn68k_c_stream);
        generate_code_for_list(ls->cdr->cdr,(int)pFVar19,info_06,pCVar15);
        fputs(") ",(FILE *)syn68k_c_stream);
        pLVar16 = ls->cdr;
        TVar9 = (pLVar16->token).type;
        goto LAB_0010d71d;
      }
LAB_0010d833:
      if ((pLVar16->cdr->token).type == TOK_LIST) {
        iVar8 = list_length(pLVar16->cdr->car);
        pLVar16 = ls->cdr;
        if (iVar8 != 3) goto LAB_0010d908;
        BVar10 = tokens_equal(&pLVar16->cdr->car->cdr->token,&pLVar16->token);
        pLVar16 = ls->cdr;
        if (BVar10 == FALSE) goto LAB_0010d908;
        if ((pLVar16->token).type == TOK_LIST) {
          BVar10 = lists_equal(pLVar16->car,pLVar16->cdr->car->cdr->car);
          pLVar16 = ls->cdr;
          if (BVar10 == FALSE) goto LAB_0010d908;
        }
        pPVar18 = (ParsedOpcodeInfo *)pLVar16->cdr->car;
        uVar5 = *(uint *)&pPVar18->amode;
        uVar17 = uVar5 - 0x2e;
        if ((7 < uVar17) && (uVar17 = uVar5 - 0x2b, 1 < uVar17)) goto LAB_0010d908;
        if (((pLVar16->token).type == TOK_ADDRESS_REGISTER) &&
           ((pLVar16->token).u.reginfo.size == '\x02')) {
          (pLVar16->token).u.reginfo.size = '\x04';
          generate_code_for_list(ls->cdr,uVar17,pPVar18,(CCVariant *)pLVar16);
          pcVar12 = unparse_token(&ls->cdr->cdr->car->token,(char *)&local_238);
          fputs(pcVar12,(FILE *)syn68k_c_stream);
          pcVar12 = "= (int16)";
        }
        else {
          if (((uVar5 & 0xfffffffe) == 0x2e) &&
             (pPVar18 = *(ParsedOpcodeInfo **)pPVar18->name, *(int *)&pPVar18->amode == 0x1d)) {
            pLVar23 = pPVar18->misc_flags;
            if ((pLVar23 == (List *)0x1) || (pLVar23 == (List *)0xffffffffffffffff)) {
              bVar24 = (pLVar23 == (List *)0xffffffffffffffff) != (uVar5 == 0x2e);
              pLVar16 = (ListStruct *)CONCAT71((int7)((ulong)pLVar16 >> 8),bVar24);
              pcVar12 = "(--";
              if (bVar24) {
                pcVar12 = "(++";
              }
              pFVar19 = syn68k_c_stream;
              fputs(pcVar12,(FILE *)syn68k_c_stream);
              iVar8 = (int)pFVar19;
              pLVar13 = ls->cdr;
              pPVar18 = extraout_RDX_12;
              goto LAB_0010da46;
            }
            if (((pLVar16->token).u.reginfo.size == '\x04') &&
               ((pLVar16->token).u.string != (char *)0xffffffff80000000)) {
              uVar17 = (uint)pLVar23;
              if ((int)uVar17 < 0) {
                pcVar12 = "(INC_VAR (";
                if (uVar5 == 0x2e) {
                  pcVar12 = "(DEC_VAR (";
                }
                pFVar19 = syn68k_c_stream;
                fputs(pcVar12,(FILE *)syn68k_c_stream);
                generate_code_for_list(ls->cdr,(int)pFVar19,info_14,(CCVariant *)pLVar16);
                uVar17 = -uVar17;
              }
              else {
                pcVar12 = "(DEC_VAR (";
                if (uVar5 == 0x2e) {
                  pcVar12 = "(INC_VAR (";
                }
                pFVar19 = syn68k_c_stream;
                fputs(pcVar12,(FILE *)syn68k_c_stream);
                generate_code_for_list(ls->cdr,(int)pFVar19,info_13,(CCVariant *)pLVar16);
                uVar17 = uVar17 & 0x7fffffff;
              }
              fprintf((FILE *)syn68k_c_stream,", %ld)) ",(ulong)uVar17);
              goto LAB_0010d163;
            }
          }
          generate_code_for_list(pLVar16,uVar5 & 0xfffffffe,pPVar18,(CCVariant *)pLVar16);
          pcVar12 = unparse_token(&ls->cdr->cdr->car->token,(char *)&local_238);
          fputs(pcVar12,(FILE *)syn68k_c_stream);
          pcVar12 = "= ";
        }
        pFVar19 = syn68k_c_stream;
        fputs(pcVar12,(FILE *)syn68k_c_stream);
        iVar8 = (int)pFVar19;
        pLVar13 = ls->cdr->cdr->car->cdr;
        pPVar18 = extraout_RDX_13;
LAB_0010d982:
        pLVar13 = pLVar13->cdr;
      }
      else {
LAB_0010d908:
        ppLVar7 = &pLVar16->cdr;
        pLVar16 = (ListStruct *)&pLVar16->token;
        pTVar22 = &(*ppLVar7)->token;
        BVar10 = tokens_equal((Token *)pLVar16,pTVar22);
        iVar8 = (int)pTVar22;
        pPVar18 = extraout_RDX_07;
        if (BVar10 == FALSE) {
LAB_0010d947:
          pLVar23 = ls->cdr;
          if (((pLVar23->token).type == TOK_ADDRESS_REGISTER) &&
             ((pLVar23->token).u.reginfo.size == '\x02')) {
            (pLVar23->token).u.reginfo.size = '\x04';
            generate_code_for_list(ls->cdr,iVar8,pPVar18,(CCVariant *)pLVar16);
            pcVar12 = "= (int16) ";
          }
          else {
            generate_code_for_list(pLVar23,iVar8,pPVar18,(CCVariant *)pLVar16);
            pcVar12 = "= ";
          }
          pFVar19 = syn68k_c_stream;
          fputs(pcVar12,(FILE *)syn68k_c_stream);
          iVar8 = (int)pFVar19;
          pLVar13 = ls->cdr;
          pPVar18 = extraout_RDX_09;
          goto LAB_0010d982;
        }
        pLVar16 = ls->cdr->cdr;
        pLVar23 = pLVar16->car;
        BVar10 = lists_equal(ls->cdr->car,pLVar23);
        iVar8 = (int)pLVar23;
        pPVar18 = extraout_RDX_08;
        if (BVar10 == FALSE) goto LAB_0010d947;
        pLVar13 = ls->cdr;
      }
      generate_code_for_list(pLVar13,iVar8,pPVar18,(CCVariant *)pLVar16);
      goto LAB_0010d163;
    case TOK_BITWISE_NOT:
      if (ls->cdr == (ListStruct *)0x0) {
        pcVar12 = "\"~\" missing an argument!\n";
        goto LAB_0010d7f9;
      }
      pcVar12 = "(~";
LAB_0010d5b3:
      pFVar19 = syn68k_c_stream;
      fputs(pcVar12,(FILE *)syn68k_c_stream);
      iVar8 = (int)pFVar19;
      pLVar16 = ls->cdr;
      pPVar18 = extraout_RDX_01;
LAB_0010d5bb:
      generate_code_for_list(pLVar16,iVar8,pPVar18,(CCVariant *)info_00);
LAB_0010cd6f:
      pcVar12 = ") ";
      break;
    case TOK_FUNC_CALL:
      pLVar16 = ls->cdr;
      if ((pLVar16 == (ListStruct *)0x0) || ((pLVar16->token).type != TOK_QUOTED_STRING)) {
        pcVar12 = "\"call\" must be followed by a function name in quotes.\n";
        goto LAB_0010d9d7;
      }
      pcVar12 = "%s (";
      fprintf((FILE *)syn68k_c_stream,"%s (",(pLVar16->token).u.string);
      pPVar18 = extraout_RDX_04;
      for (pLVar16 = ls->cdr->cdr;
          (pLVar16 != (List *)0x0 &&
          (generate_code_for_list(pLVar16,(int)pcVar12,pPVar18,(CCVariant *)info_00),
          pLVar16->cdr != (ListStruct *)0x0)); pLVar16 = pLVar16->cdr) {
        pcVar12 = (char *)syn68k_c_stream;
        fputs(", ",(FILE *)syn68k_c_stream);
        pPVar18 = extraout_RDX_05;
      }
      goto LAB_0010cd6f;
    case TOK_CAST:
      pLVar16 = ls->cdr;
      if ((pLVar16 == (ListStruct *)0x0) || ((pLVar16->token).type != TOK_QUOTED_STRING)) {
        pcVar12 = "\"cast\" must be followed by a C type in quotes.\n";
        goto LAB_0010d9d7;
      }
      iVar8 = 0x113186;
      fprintf((FILE *)syn68k_c_stream,"((%s) ",(pLVar16->token).u.string);
      pLVar16 = ls->cdr->cdr;
      pPVar18 = extraout_RDX_03;
      goto LAB_0010d5bb;
    case TOK_DEREF:
      uVar3 = (ls->token).u.reginfo.size;
      iVar8 = list_length(ls);
      if (uVar3 != '\0') {
        if (iVar8 != 2) {
          pcVar12 = "Typed deref must have exactly one argument!\n";
          goto LAB_0010d9d7;
        }
        uVar11 = (ulong)(ls->token).u.reginfo.size;
        pCVar15 = (CCVariant *)(ulong)(ls->token).u.reginfo.sgnd;
        if (uVar11 == 4) {
          iVar8 = 0x1131df;
          fprintf((FILE *)syn68k_c_stream,"READ%cL_UNSWAPPED ((CLEAN (",
                  (ulong)((uint)(pCVar15 == (CCVariant *)0x0) * 2 + 0x53));
          pPVar18 = extraout_RDX;
        }
        else {
          pCVar15 = (CCVariant *)(ctypes + (long)pCVar15);
          iVar8 = 0x1131bf;
          fprintf((FILE *)syn68k_c_stream,"DEREF(%s, SYN68K_TO_US (CLEAN (",
                  *(char **)((long)&pCVar15->field_0x0 + uVar11 * 8));
          pPVar18 = extraout_RDX_10;
        }
        generate_code_for_list(ls->cdr,iVar8,pPVar18,pCVar15);
        pcVar12 = "))) ";
        break;
      }
      if (iVar8 != 4) {
        pcVar12 = "Untyped deref requires three args (ptr type, value, offset).\n";
LAB_0010d9d7:
        parse_error(ls,pcVar12);
        return;
      }
      if ((ls->cdr->token).type != TOK_QUOTED_STRING) {
        pcVar12 = "Untyped deref must have second arg be a quoted string C type.\n";
        goto LAB_0010d9d7;
      }
      iVar8 = 0x113183;
      fprintf((FILE *)syn68k_c_stream,"(*(((%s) ",(ls->cdr->token).u.string);
      generate_code_for_list(ls->cdr->cdr,iVar8,info_12,(CCVariant *)info_00);
      pFVar19 = syn68k_c_stream;
      fputs(") + ",(FILE *)syn68k_c_stream);
      iVar8 = (int)pFVar19;
      pLVar16 = ls->cdr->cdr->cdr;
      pPVar18 = extraout_RDX_06;
      goto LAB_0010d327;
    case TOK_SWAP:
      info_00 = (uint *)(ulong)((uint)((ls->cdr->token).type == TOK_NUMBER) * 0x50);
      pFVar19 = syn68k_c_stream;
      fputs(*(char **)(&((CCVariant *)((long)info_00 + (ulong)(ls->token).u.reginfo.sgnd * 0x28))->
                        field_0x0 +
                      (long)(generate_code_for_list::swap_macro[0][0] + (ls->token).u.reginfo.size))
            ,(FILE *)syn68k_c_stream);
      iVar8 = (int)pFVar19;
      pLVar16 = ls->cdr;
      pPVar18 = extraout_RDX_00;
LAB_0010d327:
      generate_code_for_list(pLVar16,iVar8,pPVar18,(CCVariant *)info_00);
LAB_0010ce77:
      pcVar12 = ")) ";
      break;
    case TOK_EXPLICIT_LIST:
      for (pLVar16 = ls->cdr; pLVar16 != (List *)0x0; pLVar16 = pLVar16->cdr) {
        generate_code_for_list(pLVar16,(int)pFVar19,info,(CCVariant *)info_00);
        fputs(";\n",(FILE *)syn68k_c_stream);
        pFVar19 = syn68k_c_stream;
        fputs("        ",(FILE *)syn68k_c_stream);
        info = extraout_RDX_02;
      }
      return;
    }
  }
  fputs(pcVar12,(FILE *)syn68k_c_stream);
  return;
}

Assistant:

static void
generate_code_for_list (List *ls, int m68kop, const ParsedOpcodeInfo *info,
			const CCVariant *var)
{
  char buf[512];
  Token *t;
  BOOL done;

  if (ls == NULL)
    return;

  /* If they have several sublists of code, generate code for each of them. */
  t = &ls->token;
  switch (t->type) {

    /* If we've found a list, look at the operator for that list and
     * generate code appropriately. */
  case TOK_LIST:
    if (ls->car == NULL)
      return;
    ls = ls->car;
    t = &ls->token;

    switch (ls->token.type) {
    case TOK_EXPLICIT_LIST:
      /* Loop over all the lists of code and generate c for them. */
      for (ls = ls->cdr; ls != NULL; ls = ls->cdr)
	{
	  generate_code_for_list (ls, m68kop, info, var);
	  fputs (";\n", syn68k_c_stream);
	  fputs ("        ", syn68k_c_stream);
	}
      break;

    case TOK_ASSIGN:
      putc ('(', syn68k_c_stream);
      done = FALSE;

      /* If they are writing out to a long, generate appropriate code
       * that will work on a QUADALIGN machine.
       */
      if (ls->cdr->token.type == TOK_LIST
	  && CADR (ls)->token.type == TOK_DEREF
	  && CADR (ls)->token.u.derefinfo.size == 4)
	{
	  fprintf (syn68k_c_stream,
		   "WRITE%cL_UNSWAPPED (SYN68K_TO_US (CLEAN (",
		   CADR (ls)->token.u.derefinfo.sgnd ? 'S' : 'U');
	  generate_code_for_list (CDADR (ls), m68kop, info, var);
	  fputs (")), ", syn68k_c_stream);
	  generate_code_for_list (CDDR (ls), m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	  done = TRUE;
	}
      if ((ls->cdr->token.type == TOK_AMODE
	   || ls->cdr->token.type == TOK_REVERSED_AMODE
	   || ls->cdr->token.type == TOK_DOLLAR_AMODE
	   || ls->cdr->token.type == TOK_DOLLAR_REVERSED_AMODE)
	  && ls->cdr->token.u.amodeinfo.size == 4)
	{
	  fprintf (syn68k_c_stream,
		   "WRITE%cL_UNSWAPPED (SYN68K_TO_US (CLEAN (",
		   ls->cdr->token.u.derefinfo.sgnd ? 'S' : 'U');
	  switch (ls->cdr->token.type) {
	  case TOK_DOLLAR_AMODE:
	    fputs (" (cpu_state.amode_p) ", syn68k_c_stream);
	    break;
	  case TOK_DOLLAR_REVERSED_AMODE:
	    fputs (" (cpu_state.reversed_amode_p) ",
		   syn68k_c_stream);
	    break;
	  case TOK_AMODE:
	    ls->cdr->token.type = TOK_AMODE_PTR;
	    generate_code_for_list (ls->cdr, m68kop, info, var);
	    ls->cdr->token.type = TOK_AMODE;
	    break;
	  case TOK_REVERSED_AMODE:
	  default:
	    ls->cdr->token.type = TOK_REVERSED_AMODE_PTR;
	    generate_code_for_list (ls->cdr, m68kop, info, var);
	    ls->cdr->token.type = TOK_REVERSED_AMODE;
	    break;
	  }
	  fputs (")), ", syn68k_c_stream);
	  generate_code_for_list (CDDR (ls), m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	  done = TRUE;
	}


      /* Do stuff like (assign d0.ul.n (+ d0.ul.n 5)) -> "d0.ul.n += 5" */
      if (!done && CDDR (ls)->token.type == TOK_LIST
	  && list_length (CADDR (ls)) == 3
	  && tokens_equal (&CDR (CADDR (ls))->token, &CDR (ls)->token))
	{
	  if (CDR (ls)->token.type != TOK_LIST
	      || lists_equal (CADR (ls), CADR (CADDR (ls))))
	    {
	      switch (CADDR (ls)->token.type) {
	      case TOK_BITWISE_AND:
	      case TOK_BITWISE_OR:
	      case TOK_BITWISE_XOR:
	      case TOK_PLUS:
	      case TOK_MINUS:
	      case TOK_MULTIPLY:
	      case TOK_DIVIDE:
	      case TOK_MOD:
	      case TOK_SHIFT_LEFT:
	      case TOK_SHIFT_RIGHT:
		/* Word-sized operations to address registers deal with
		 * the entire address register; the RHS is sign extended.
		 */
		if (ls->cdr->token.type == TOK_ADDRESS_REGISTER
		    && ls->cdr->token.u.reginfo.size == 2)
		  {
		    ls->cdr->token.u.reginfo.size = 4;
		    generate_code_for_list (ls->cdr, m68kop, info, var);
		    fputs (unparse_token (&CADDR (ls)->token, buf),
			   syn68k_c_stream);
		    fputs ("= (int16)", syn68k_c_stream);
		    generate_code_for_list (CDDR (CADDR (ls)), m68kop,
					    info, var);
		  }
		else  /* Not a word-sized op to an address register. */
		  {
		    TokenType optype = CADDR (ls)->token.type;

		    /* Change foo += 1 to ++foo.  Why?  It turns out
		     * that gcc sometimes generates better code for ++foo.
		     * Annoying, isn't it?
		     */
		    if ((optype == TOK_PLUS || optype == TOK_MINUS)
			&& CDDR (CADDR (ls))->token.type == TOK_NUMBER
			&& (CDDR (CADDR (ls))->token.u.n == 1
			    || CDDR (CADDR (ls))->token.u.n == -1))
		      {
			if ((optype == TOK_PLUS)
			    ^ (CDDR (CADDR (ls))->token.u.n == -1))
			  fputs ("(++", syn68k_c_stream);
			else
			  fputs ("(--", syn68k_c_stream);
			generate_code_for_list (ls->cdr, m68kop, info, var);
			fputs (") ", syn68k_c_stream);
		      }
		    /* Change foo += 5 to a weird macro...this also seems
		     * to help gcc.
		     */
		    else if ((optype == TOK_PLUS || optype == TOK_MINUS)
			     && CDDR (CADDR (ls))->token.type == TOK_NUMBER
			     && ls->cdr->token.u.reginfo.size == 4
			     && ls->cdr->token.u.n != (int32) 0x80000000)
		      {
			int32 val = CDDR (CADDR (ls))->token.u.n;
			if (val >= 0)
			  {
			    if (optype == TOK_PLUS)
			      fputs ("(INC_VAR (", syn68k_c_stream);
			    else
			      fputs ("(DEC_VAR (", syn68k_c_stream);
			    generate_code_for_list (ls->cdr, m68kop, info,
						    var);
			    fprintf (syn68k_c_stream, ", %ld)) ", (long) val);
			  }
			else  /* val < 0 */
			  {
			    if (optype == TOK_PLUS)
			      fputs ("(DEC_VAR (", syn68k_c_stream);
			    else
			      fputs ("(INC_VAR (", syn68k_c_stream);
			    generate_code_for_list (ls->cdr, m68kop, info,
						    var);
			    fprintf (syn68k_c_stream, ", %ld)) ", (long) -val);
			  }
		      }
		    else
		      {
			generate_code_for_list (ls->cdr, m68kop, info, var);
			fputs (unparse_token (&CADDR (ls)->token, buf),
			       syn68k_c_stream);
			fputs ("= ", syn68k_c_stream);
			generate_code_for_list (CDDR (CADDR (ls)), m68kop,
						info, var);
		      }
		  }
		done = TRUE;
		break;
	      default:
		break;
	      }
	    }
	}

      /* See if we are assigning something to itself.  This can happen
       * when expanding out code, and gcc hasn't been eliminating these
       * pointless assigns.  Here we just output the LHS of the assignment,
       * in case the value of the assignment as a whole is being used for
       * something (eg, "d0.ul.n = d0.ul.n"  ->  "d0.ul.n")
       */
      if (!done)
	{
	  if (tokens_equal (&ls->cdr->token, &(CDDR (ls))->token)
	      && lists_equal (CADR (ls), CADDR (ls)))
	    {
	      generate_code_for_list (ls->cdr, m68kop, info, var);
	      done = TRUE;
	    }
	}

      if (!done)
	{
	  /* Force word moves into address registers to be sign extended. */
	  if (ls->cdr->token.type == TOK_ADDRESS_REGISTER
	      && ls->cdr->token.u.reginfo.size == 2)
	    {
	      ls->cdr->token.u.reginfo.size = 4;
	      generate_code_for_list (ls->cdr, m68kop, info, var);
	      fputs ("= (int16) ", syn68k_c_stream);
	    }
	  else
	    {
	      generate_code_for_list (ls->cdr, m68kop, info, var);
	      fputs ("= ", syn68k_c_stream);
	    }
	  generate_code_for_list (CDDR (ls), m68kop, info, var);
	}
      fputs (") ", syn68k_c_stream);
      break;

      /* Have to special case boolean xor since C doesn't have ^^ analagous to
       * && and ||.
       */
    case TOK_XOR:
      for (ls = ls->cdr; ls != NULL; ls = ls->cdr)
	{
	  fputs ("(!", syn68k_c_stream);
	  generate_code_for_list (ls, m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	  if (ls->cdr != NULL)
	    fputs ("^ ", syn68k_c_stream);
	}
      break;
    case TOK_NOT:
      if (ls->cdr == NULL)
	{
	  parse_error (ls, "\"not\" missing an argument!\n");
	  fputs ("0 ", syn68k_c_stream);
	}
      else
	{
	  fputs ("(!", syn68k_c_stream);
	  generate_code_for_list (ls->cdr, m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	}
      break;

    case TOK_BITWISE_NOT:
      if (ls->cdr == NULL)
	{
	  parse_error (ls, "\"~\" missing an argument!\n");
	  fputs ("0 ", syn68k_c_stream);
	}
      else
	{
	  fputs ("(~", syn68k_c_stream);
	  generate_code_for_list (ls->cdr, m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	}
      break;

    case TOK_AND:
      binary_op_list ("&&", ls->cdr, m68kop, info, var);
      break;
    case TOK_OR:
      binary_op_list ("||", ls->cdr, m68kop, info, var);
      break;
    case TOK_EQUAL:
      binary_op_list ("==", ls->cdr, m68kop, info, var);  /* 2 args but OK. */
      break;
    case TOK_NOT_EQUAL:
      binary_op_list ("!=", ls->cdr, m68kop, info, var);  /* 2 args but OK. */
      break;
    case TOK_GREATER_THAN:
    case TOK_LESS_THAN:
    case TOK_GREATER_OR_EQUAL:
    case TOK_PLUS:
    case TOK_MINUS:
    case TOK_LESS_OR_EQUAL:
    case TOK_MULTIPLY:
    case TOK_DIVIDE:
    case TOK_MOD:
    case TOK_BITWISE_AND:
    case TOK_BITWISE_OR:
    case TOK_BITWISE_XOR:
      unparse_token (&ls->token, buf);
      binary_op_list (buf, ls->cdr, m68kop, info, var);
      break;

    case TOK_SHIFT_LEFT:
    case TOK_SHIFT_RIGHT:
      unparse_token (&ls->token, buf);
      binary_op_list (buf, ls->cdr, m68kop, info, var);
      break;

    case TOK_DEFAULT:
      fputs ("default ", syn68k_c_stream);
      break;

    case TOK_SWITCH:
      fputs ("switch (", syn68k_c_stream);
      generate_code_for_list (ls->cdr, m68kop, info, var);
      fputs (") {\n", syn68k_c_stream);
      for (ls = CDDR (ls); ls != NULL; ls = ls->cdr)
	{
	  if (ls->car->token.type == TOK_DEFAULT)
	    fputs ("        default: ", syn68k_c_stream);
	  else
	    {
	      fputs ("        case ", syn68k_c_stream);
	      generate_code_for_list (ls->car, m68kop, info, var);
	      fputs (": ", syn68k_c_stream);
	    }
	  generate_code_for_list (CDAR (ls), m68kop, info, var);
	  fputs ("; break;\n", syn68k_c_stream);
	}
      fputs ("}\n        ", syn68k_c_stream);
      break;

    case TOK_IF:
      fputs ("if (", syn68k_c_stream);
      generate_code_for_list (ls->cdr, m68kop, info, var);
      fputs (") { ", syn68k_c_stream);
      generate_code_for_list (CDDR (ls), m68kop, info, var);
      fputs (";} ", syn68k_c_stream);
      if (CDDDR (ls) != NULL)
	{
	  fputs ("else { ", syn68k_c_stream);
	  generate_code_for_list (CDDDR (ls), m68kop, info, var);
	  fputs (";} ", syn68k_c_stream);
	}
      break;

    case TOK_SWAP:
      {
	static const char *swap_macro[2][2][5] = {
	  {{ "ERR", "((uint8) (", "(SWAPUW_IFLE (", "ERR", "(SWAPUL_IFLE (" },
	   { "ERR", "((int8) (",  "(SWAPSW_IFLE (", "ERR", "(SWAPSL_IFLE (" }},
	  {{ "ERR", "((uint8) (", "(SWAPUW_IFLE (", "ERR",
	       "(SWAPUL_IFLE (" },
	   { "ERR", "((int8) (",  "(SWAPSW_IFLE (", "ERR",
	       "(SWAPSL_IFLE (" }}
	};

	fputs (swap_macro[(ls->cdr->token.type == TOK_NUMBER)]
			  [t->u.swapinfo.sgnd][t->u.swapinfo.size],
	       syn68k_c_stream);
	generate_code_for_list (ls->cdr, m68kop, info, var);
	fputs (")) ", syn68k_c_stream);
      }
      break;

    case TOK_CAST:
      if (ls->cdr == NULL || ls->cdr->token.type != TOK_QUOTED_STRING)
	{
	  parse_error (ls, "\"cast\" must be followed by a C type "
		       "in quotes.\n");
	}
      else
	{
	  fprintf (syn68k_c_stream, "((%s) ", ls->cdr->token.u.string);
	  generate_code_for_list (CDDR (ls), m68kop, info, var);
	  fputs (") ", syn68k_c_stream);
	}
      break;

    case TOK_DEREF:
      if (t->u.derefinfo.size == 0)  /* Untyped deref? */
	{
	  if (list_length (ls) != 4)
	    parse_error (ls, "Untyped deref requires three args (ptr type, "
			 "value, offset).\n");
	  else if (ls->cdr->token.type != TOK_QUOTED_STRING)
	    parse_error (ls, "Untyped deref must have second arg be "
			 "a quoted string C type.\n");
	  else
	    {
	      /* We intentionally leave out the CLEAN here; you don't
	       * want to CLEAN the code pointer, for instance!  In general
	       * if you use an untyped deref you have to be more careful...
	       */
	      fprintf (syn68k_c_stream, "(*(((%s) ",
		       ls->cdr->token.u.string);
	      generate_code_for_list (CDDR (ls), m68kop, info, var);
	      fputs (") + ", syn68k_c_stream);
	      generate_code_for_list (CDDDR (ls), m68kop, info, var);
	      fputs (")) ", syn68k_c_stream);
	    }
	}
      else
	{
	  if (list_length (ls) != 2)
	    parse_error (ls, "Typed deref must have exactly one argument!\n");
	  else
	    {
	      if (t->u.derefinfo.size != 4)
		fprintf (syn68k_c_stream, "DEREF(%s, SYN68K_TO_US (CLEAN (",
			 ctypes[t->u.derefinfo.sgnd][t->u.derefinfo.size]);
	      else
		fprintf (syn68k_c_stream,
			 "READ%cL_UNSWAPPED ((CLEAN (",
			 t->u.derefinfo.sgnd ? 'S' : 'U');
	      generate_code_for_list (ls->cdr, m68kop, info, var);
	      fputs ("))) ", syn68k_c_stream);
	    }
	}
      break;

    case TOK_FUNC_CALL:
      if (ls->cdr == NULL || ls->cdr->token.type != TOK_QUOTED_STRING)
	{
	  parse_error (ls, "\"call\" must be followed by a function name "
		       "in quotes.\n");
	}
      else
	{
	  List *l2;
	  fprintf (syn68k_c_stream, "%s (", ls->cdr->token.u.string);
	  for (l2 = CDDR (ls); l2 != NULL; l2 = l2->cdr)
	    {
	      generate_code_for_list (l2, m68kop, info, var);
	      if (l2->cdr != NULL)
		fputs (", ", syn68k_c_stream);
	    }
	  fputs (") ", syn68k_c_stream);
	}
      break;

      /* Skip NOPs, however they were introduced. */
    case TOK_NOP:
      break;

    default:
      parse_error (ls, "Unknown operator for code list: %s\n",
		   unparse_token (&ls->token, buf));
      break;
    }
    break;

    /* Skip NOPs, however they were introduced. */
  case TOK_NOP:
    break;

  case TOK_TRUE:
    fputs ("1 ", syn68k_c_stream);
    break;

  case TOK_FALSE:
    fputs ("0 ", syn68k_c_stream);
    break;

  case TOK_CODE:
    fputs ("code ", syn68k_c_stream);
    break;

  case TOK_DOLLAR_DATA_REGISTER:
    {
      Token temp = *t;
      /* Compensate for gcc i386 brain damage. */
      fprintf (syn68k_c_stream, "DATA_REGISTER_%c%c (",
	       t->u.dollarinfo.sgnd ? 'S' : 'U',
	       "?BW?L"[t->u.dollarinfo.size]);
      t->type = TOK_DOLLAR_NUMBER;
      t->u.dollarinfo.sgnd = FALSE;
      t->u.dollarinfo.size = 4;
      generate_code_for_list (ls, m68kop, info, var);
      *t = temp;
      fputs (") ", syn68k_c_stream);
    }
    break;

  case TOK_DOLLAR_ADDRESS_REGISTER:
    {
      Token temp = *t;
      fprintf (syn68k_c_stream, "ADDRESS_REGISTER_%c%c ( ",
	       t->u.dollarinfo.sgnd ? 'S' : 'U',
	       "?BW?L"[t->u.dollarinfo.size]);
      t->type = TOK_DOLLAR_NUMBER;
      t->u.dollarinfo.sgnd = FALSE;
      t->u.dollarinfo.size = 4;
      generate_code_for_list (ls, m68kop, info, var);
      *t = temp;
      fputs (") ", syn68k_c_stream);
    }
    break;

  case TOK_DOLLAR_GENERAL_REGISTER:
    {
      Token temp = *t;
      fprintf (syn68k_c_stream, "GENERAL_REGISTER_%c%c (",
	       t->u.dollarinfo.sgnd ? 'S' : 'U',
	       "?BW?L"[t->u.dollarinfo.size]);
      t->type = TOK_DOLLAR_NUMBER;
      t->u.dollarinfo.sgnd = FALSE;
      t->u.dollarinfo.size = 4;
      generate_code_for_list (ls, m68kop, info, var);
      *t = temp;
      fputs (") ", syn68k_c_stream);
    }
    break;

  case TOK_TEMP_REGISTER:
    fprintf (syn68k_c_stream, "tmp%d%s ", t->u.reginfo.which,
	     regdesc[t->u.reginfo.sgnd][t->u.reginfo.size]);
    break;

  case TOK_DATA_REGISTER:
    fprintf (syn68k_c_stream, "DATA_REGISTER_%c%c (%d) ",
	     t->u.dollarinfo.sgnd ? 'S' : 'U',
	     "?BW?L"[t->u.dollarinfo.size],
	     t->u.reginfo.which);
    break;

  case TOK_ADDRESS_REGISTER:
    fprintf (syn68k_c_stream, "ADDRESS_REGISTER_%c%c (%d) ",
	     t->u.dollarinfo.sgnd ? 'S' : 'U',
	     "?BW?L"[t->u.dollarinfo.size],
	     t->u.reginfo.which);
    break;

  case TOK_AMODE_PTR:
  case TOK_REVERSED_AMODE_PTR:
    fputs ("(US_TO_SYN68K (", syn68k_c_stream);
    output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE_PTR));
    fputs ("))", syn68k_c_stream);
    break;

  case TOK_AMODE:
  case TOK_REVERSED_AMODE:
    if (t->u.dollarinfo.size != 4)
      {
	fprintf (syn68k_c_stream, "DEREF(%s, CLEAN (",
		 ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs (")) ", syn68k_c_stream);
      }
    else
      {
#if 0
	fputs ("\n"
	       "#ifdef QUADALIGN\n"
	       "# ifdef BIGENDIAN\n", syn68k_c_stream);

	fprintf (syn68k_c_stream, "((%s) (((((uint16 *) CLEAN (",
		 ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs ("))[0]) << 16) | (((uint16 *) CLEAN (", syn68k_c_stream);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs ("))[1])))\n", syn68k_c_stream);
	
	fputs ("# else\n", syn68k_c_stream);
	
	fprintf (syn68k_c_stream, "((%s) ((((uint16 *) CLEAN (",
		 ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs ("))[0]) | ((((uint16 *) CLEAN (", syn68k_c_stream);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs ("))[1]) << 16)))\n", syn68k_c_stream);

	fputs ("# endif\n"
	       "#else\n", syn68k_c_stream);
	fprintf (syn68k_c_stream, "(*(%s *) CLEAN (",
		 ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs (")) ", syn68k_c_stream);
	fputs ("\n#endif\n", syn68k_c_stream);
#else
	fprintf (syn68k_c_stream, "READ%cL_UNSWAPPED (CLEAN",
		 t->u.dollarinfo.sgnd ? 'S' : 'U');
	output_c_for_amode_ptr (t, (t->type == TOK_REVERSED_AMODE));
	fputs (") ", syn68k_c_stream);
#endif
      }
    break;

  case TOK_NUMBER:
    if (t->u.n >= 100 || t->u.n <= -100)
      fprintf (syn68k_c_stream, "((int32) 0x%lX) ", (unsigned long)t->u.n);
    else fprintf (syn68k_c_stream, "%ld ", t->u.n);
    break;

    /* Pass quoted strings on to the C compiler. */
  case TOK_QUOTED_STRING:
    fprintf (syn68k_c_stream, "%s ", t->u.string);  /* Append a space. */
    break;

  case TOK_CCC:  fputs ("cpu_state.ccc ",  syn68k_c_stream); break;
  case TOK_CCN:  fputs ("cpu_state.ccn ",  syn68k_c_stream); break;
  case TOK_CCV:  fputs ("cpu_state.ccv ",  syn68k_c_stream); break;
  case TOK_CCX:  fputs ("cpu_state.ccx ",  syn68k_c_stream); break;
  case TOK_CCNZ: fputs ("cpu_state.ccnz ", syn68k_c_stream); break;

    /* If we still haven't been able to resolve the addressing mode,
     * a pointer to the data should have been put in the appropriate
     * local variable by a preceding instruction.
     */
  case TOK_DOLLAR_AMODE:
    if (t->u.dollarinfo.size != 4)
      fprintf (syn68k_c_stream, "DEREF(%s, SYN68K_TO_US(cpu_state.amode_p)) ",
	       ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    else
      fprintf (syn68k_c_stream, "READ%cL_UNSWAPPED ( (cpu_state.amode_p)) ",
	       t->u.dollarinfo.sgnd ? 'S' : 'U');
    break;

  case TOK_DOLLAR_REVERSED_AMODE:
    if (t->u.dollarinfo.size != 4)
      fprintf (syn68k_c_stream, "DEREF(%s, SYN68K_TO_US(cpu_state.reversed_amode_p)) ",
	       ctypes[t->u.dollarinfo.sgnd][t->u.dollarinfo.size]);
    else
      fprintf (syn68k_c_stream,
	       "READ%cL_UNSWAPPED ( (cpu_state.reversed_amode_p)) ",
	       t->u.dollarinfo.sgnd ? 'S' : 'U');
    break;

  case TOK_DOLLAR_AMODE_PTR:
    fprintf (syn68k_c_stream, " (cpu_state.amode_p) ");
    break;

  case TOK_DOLLAR_REVERSED_AMODE_PTR:
    fprintf (syn68k_c_stream, " (cpu_state.reversed_amode_p) ");
    break;

  case TOK_DOLLAR_NUMBER:
#if	1 || !defined(TEMPS_AT_TOP)
    fprintf (syn68k_c_stream, "operand_%d ", t->u.dollarinfo.which);
#else	/* defined(TEMPS_AT_TOP) */
    fprintf (syn68k_c_stream, "operand_%s%d_%d ",
				t->u.dollarinfo.sgnd ? "" : "u",
				t->u.dollarinfo.size*8, t->u.dollarinfo.which);
#endif	/* defined(TEMPS_AT_TOP) */
    break;

  default:
    parse_error (ls, "Unknown code element: %s\n", unparse_token (t, buf));
    break;
  }
}